

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_delete_item_from_array_should_not_broken_list_structure(void)

{
  cJSON *object;
  cJSON *array_00;
  cJSON *item;
  cJSON *item_00;
  char *pcVar1;
  long in_FS_OFFSET;
  cJSON *item2;
  cJSON *item1;
  cJSON *array;
  cJSON *root;
  char *str3;
  char *str2;
  char *str1;
  char expected_json3 [21];
  char acStack_58 [8];
  char expected_json2 [33];
  char acStack_28 [8];
  char expected_json1 [21];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  builtin_strncpy(expected_json1 + 8,"\"}]}",5);
  builtin_strncpy(acStack_28,"{\"rd\":[{",8);
  builtin_strncpy(expected_json1,"\"a\":\"123",8);
  builtin_strncpy(expected_json2 + 8,"\"},{\"b\":\"456\"}]}",0x11);
  builtin_strncpy(acStack_58,"{\"rd\":[{",8);
  builtin_strncpy(expected_json2,"\"a\":\"123",8);
  builtin_strncpy(expected_json3 + 8,"\"}]}",5);
  str1 = (char *)0x7b5b3a226472227b;
  builtin_strncpy(expected_json3,"\"b\":\"456",8);
  object = cJSON_Parse("{}");
  array_00 = cJSON_AddArrayToObject(object,"rd");
  item = cJSON_Parse("{\"a\":\"123\"}");
  item_00 = cJSON_Parse("{\"b\":\"456\"}");
  cJSON_AddItemToArray(array_00,item);
  pcVar1 = cJSON_PrintUnformatted(object);
  UnityAssertEqualString(acStack_28,pcVar1,(char *)0x0,0x259);
  free(pcVar1);
  cJSON_AddItemToArray(array_00,item_00);
  pcVar1 = cJSON_PrintUnformatted(object);
  UnityAssertEqualString(acStack_58,pcVar1,(char *)0x0,0x25e);
  free(pcVar1);
  cJSON_DeleteItemFromArray(array_00,0);
  pcVar1 = cJSON_PrintUnformatted(object);
  UnityAssertEqualString((char *)&str1,pcVar1,(char *)0x0,0x264);
  free(pcVar1);
  cJSON_Delete(object);
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_delete_item_from_array_should_not_broken_list_structure(void)
{
    const char expected_json1[] = "{\"rd\":[{\"a\":\"123\"}]}";
    const char expected_json2[] = "{\"rd\":[{\"a\":\"123\"},{\"b\":\"456\"}]}";
    const char expected_json3[] = "{\"rd\":[{\"b\":\"456\"}]}";
    char *str1 = NULL;
    char *str2 = NULL;
    char *str3 = NULL;

    cJSON *root = cJSON_Parse("{}");

    cJSON *array = cJSON_AddArrayToObject(root, "rd");
    cJSON *item1 = cJSON_Parse("{\"a\":\"123\"}");
    cJSON *item2 = cJSON_Parse("{\"b\":\"456\"}");

    cJSON_AddItemToArray(array, item1);
    str1 = cJSON_PrintUnformatted(root);
    TEST_ASSERT_EQUAL_STRING(expected_json1, str1);
    free(str1);

    cJSON_AddItemToArray(array, item2);
    str2 = cJSON_PrintUnformatted(root);
    TEST_ASSERT_EQUAL_STRING(expected_json2, str2);
    free(str2);

    /* this should not broken list structure */
    cJSON_DeleteItemFromArray(array, 0);
    str3 = cJSON_PrintUnformatted(root);
    TEST_ASSERT_EQUAL_STRING(expected_json3, str3);
    free(str3);

    cJSON_Delete(root);
}